

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O1

int cd_match_expression_finalise(parser_info *info)

{
  node_info *pnVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  coda_expression_type result_type;
  coda_expression *expr;
  coda_expression_type local_24;
  coda_expression *local_20;
  
  pcVar5 = info->node->char_data;
  if (pcVar5 != (char *)0x0) {
    sVar3 = strlen(pcVar5);
    if (0 < (int)(uint)sVar3) {
      uVar4 = 0;
      do {
        if ((0x20 < (ulong)(byte)pcVar5[uVar4]) ||
           ((0x100002600U >> ((ulong)(byte)pcVar5[uVar4] & 0x3f) & 1) == 0)) goto LAB_001317d3;
        uVar4 = uVar4 + 1;
      } while (((uint)sVar3 & 0x7fffffff) != uVar4);
    }
    free(pcVar5);
    info->node->char_data = (char *)0x0;
  }
LAB_001317d3:
  pcVar5 = info->node->char_data;
  if (pcVar5 == (char *)0x0) {
    pcVar5 = "empty detection expression";
  }
  else {
    iVar2 = coda_expression_from_string(pcVar5,&local_20);
    if (iVar2 != 0) {
      return -1;
    }
    free(info->node->char_data);
    pnVar1 = info->node;
    pnVar1->char_data = (char *)0x0;
    *(coda_expression **)((long)pnVar1->data + 8) = local_20;
    iVar2 = coda_expression_get_type(local_20,&local_24);
    if (iVar2 != 0) {
      return -1;
    }
    if (local_24 == coda_expression_boolean) {
      return 0;
    }
    pcVar5 = "not a boolean expression";
  }
  coda_set_error(-400,pcVar5);
  return -1;
}

Assistant:

static int cd_match_expression_finalise(parser_info *info)
{
    coda_expression_type result_type;
    coda_expression *expr;

    if (info->node->char_data != NULL)
    {
        if (is_whitespace(info->node->char_data, (int)strlen(info->node->char_data)))
        {
            free(info->node->char_data);
            info->node->char_data = NULL;
        }
    }
    if (info->node->char_data == NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "empty detection expression");
        return -1;
    }

    if (coda_expression_from_string(info->node->char_data, &expr) != 0)
    {
        return -1;
    }
    free(info->node->char_data);
    info->node->char_data = NULL;
    ((coda_detection_rule_entry *)info->node->data)->expression = expr;
    if (coda_expression_get_type(expr, &result_type) != 0)
    {
        return -1;
    }
    if (result_type != coda_expression_boolean)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "not a boolean expression");
        return -1;
    }

    return 0;
}